

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  byte bVar1;
  ushort uVar2;
  sqlite3 *db;
  Vdbe *p;
  i16 iVar3;
  int iVar4;
  int iVar5;
  Upsert *pOrderBy;
  Index *pIVar6;
  Parse *pPVar7;
  SrcList *pTabList;
  ExprList *pChanges;
  Expr *pWhere;
  long lVar8;
  ulong uVar9;
  long lVar10;
  Expr *in_stack_00000008;
  Upsert *in_stack_00000010;
  
  db = pParse->db;
  p = pParse->pVdbe;
  iVar5 = pUpsert->iDataCur;
  pOrderBy = sqlite3UpsertOfIndex(pUpsert,pIdx);
  if (iVar5 != iCur && pIdx != (Index *)0x0) {
    if ((pTab->tabFlags & 0x80) == 0) {
      iVar4 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x8e,iCur,iVar4);
      sqlite3VdbeAddOp3(p,0x1e,iVar5,0,iVar4);
      if (iVar4 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar4;
        }
      }
    }
    else {
      pIVar6 = sqlite3PrimaryKeyIndex(pTab);
      uVar2 = pIVar6->nKeyCol;
      iVar4 = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + (uint)uVar2;
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = sqlite3TableColumnToIndex(pIdx,pIVar6->aiColumn[uVar9]);
        sqlite3VdbeAddOp3(p,0x5e,iCur,(int)iVar3,(int)uVar9 + iVar4);
      }
      iVar5 = sqlite3VdbeAddOp4Int(p,0x1d,iVar5,0,iVar4,(uint)uVar2);
      sqlite3VdbeAddOp4(p,0x46,0xb,2,0,"corrupt database",-1);
      pPVar7 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar7 = pParse;
      }
      pPVar7->mayAbort = '\x01';
      sqlite3VdbeJumpHere(p,iVar5);
    }
  }
  pTabList = sqlite3SrcListDup(db,pUpsert->pUpsertSrc,0);
  lVar8 = 9;
  for (lVar10 = 0; lVar10 < pTab->nCol; lVar10 = lVar10 + 1) {
    if (*(char *)((long)&pTab->aCol->zCnName + lVar8) == 'E') {
      sqlite3VdbeAddOp1(p,0x57,pUpsert->regData + (int)lVar10);
    }
    lVar8 = lVar8 + 0x10;
  }
  pChanges = sqlite3ExprListDup(db,pOrderBy->pUpsertSet,0);
  pWhere = sqlite3ExprDup(db,pOrderBy->pUpsertWhere,0);
  sqlite3Update(pParse,pTabList,pChanges,pWhere,2,(ExprList *)pOrderBy,in_stack_00000008,
                in_stack_00000010);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;
  int i;
  Upsert *pTop = pUpsert;

  assert( v!=0 );
  assert( pUpsert!=0 );
  iDataCur = pUpsert->iDataCur;
  pUpsert = sqlite3UpsertOfIndex(pTop, pIdx);
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3TableColumnToIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zCnName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0,
            "corrupt database", P4_STATIC);
      sqlite3MayAbort(pParse);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pTop->pUpsertSrc - the outer INSERT statement does.
  ** So we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pTop->pUpsertSrc, 0);
  /* excluded.* columns of type REAL need to be converted to a hard real */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
      sqlite3VdbeAddOp1(v, OP_RealAffinity, pTop->regData+i);
    }
  }
  sqlite3Update(pParse, pSrc, sqlite3ExprListDup(db,pUpsert->pUpsertSet,0),
      sqlite3ExprDup(db,pUpsert->pUpsertWhere,0), OE_Abort, 0, 0, pUpsert);
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}